

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall fasttext::Model::hierarchicalSoftmax(Model *this,int32_t target,real lr)

{
  reference this_00;
  Model *this_01;
  ulong uVar1;
  size_type sVar2;
  int in_ESI;
  long in_RDI;
  real rVar3;
  int32_t i;
  vector<int,_std::allocator<int>_> *pathToRoot;
  vector<bool,_std::allocator<bool>_> *binaryCode;
  real loss;
  undefined1 in_stack_ffffffffffffffd3;
  int target_00;
  undefined4 local_14;
  
  local_14 = 0.0;
  Vector::zero((Vector *)(in_RDI + 0x50));
  this_00 = std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          *)(in_RDI + 0xb0),(long)in_ESI);
  this_01 = (Model *)std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x98),(long)in_ESI);
  target_00 = 0;
  while( true ) {
    uVar1 = (ulong)target_00;
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)this_01);
    if (sVar2 <= uVar1) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)this_01,(long)target_00);
    std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)this_01);
    rVar3 = binaryLogistic(this_01,target_00,(bool)in_stack_ffffffffffffffd3,
                           (real)((ulong)in_RDI >> 0x20));
    local_14 = rVar3 + local_14;
    target_00 = target_00 + 1;
  }
  return local_14;
}

Assistant:

real Model::hierarchicalSoftmax(int32_t target, real lr) {
  real loss = 0.0;
  grad_.zero();
  const std::vector<bool>& binaryCode = codes[target];
  const std::vector<int32_t>& pathToRoot = paths[target];
  for (int32_t i = 0; i < pathToRoot.size(); i++) {
    loss += binaryLogistic(pathToRoot[i], binaryCode[i], lr);
  }
  return loss;
}